

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O3

bool ExternalSigner::Enumerate
               (string *command,vector<ExternalSigner,_std::allocator<ExternalSigner>_> *signers,
               string chain)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  UniValue *pUVar3;
  pointer pEVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar8;
  UniValue *pUVar9;
  runtime_error *prVar10;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ExternalSigner *signer;
  pointer pEVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  UniValue *this;
  long in_FS_OFFSET;
  string_view key;
  string_view key_00;
  string_view key_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  UniValue result;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_b0.field_2;
  pcVar2 = (command->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + command->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_b0," enumerate");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  RunCommandParseJSON(&local_90,&local_b0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_90.typ == VARR) {
    pvVar8 = UniValue::getValues(&local_90);
    pUVar3 = (pvVar8->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = (pvVar8->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start; this != pUVar3; this = this + 1) {
      key._M_str = "error";
      key._M_len = 5;
      pUVar9 = UniValue::find_value(this,key);
      if (pUVar9->typ != VNULL) {
        if (pUVar9->typ == VSTR) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_b0,(tinyformat *)"\'%s\' error: %s",(char *)command,&pUVar9->val,in_R8);
          std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&local_b0,(tinyformat *)"\'%s\' error",(char *)command,in_RCX);
          std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        goto LAB_0034bd87;
      }
      key_00._M_str = "fingerprint";
      key_00._M_len = 0xb;
      pUVar9 = UniValue::find_value(this,key_00);
      if (pUVar9->typ == VNULL) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&local_b0,
                   (tinyformat *)"\'%s\' received invalid response, missing signer fingerprint",
                   (char *)command,in_RCX);
        std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0034bd87;
      }
      in_RCX = UniValue::get_str_abi_cxx11_(pUVar9);
      pEVar11 = (signers->super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pEVar4 = (signers->super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pEVar11 != pEVar4) {
        bVar6 = 0;
        do {
          bVar5 = bVar6;
          iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&pEVar11->m_fingerprint,in_RCX);
          pEVar11 = pEVar11 + 1;
          bVar6 = bVar5 | iVar7 == 0;
        } while (pEVar11 != pEVar4);
        if ((bool)(bVar5 | iVar7 == 0)) break;
      }
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      key_01._M_str = "model";
      key_01._M_len = 5;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      pUVar9 = UniValue::find_value(this,key_01);
      if ((pUVar9->typ == VSTR) &&
         (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&pUVar9->val,""), iVar7 != 0)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_b0,(pUVar9->val)._M_dataplus._M_p,(pUVar9->val)._M_string_length);
      }
      in_R8 = &local_b0;
      std::vector<ExternalSigner,std::allocator<ExternalSigner>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&>
                ((vector<ExternalSigner,std::allocator<ExternalSigner>> *)signers,command,in_RDX,
                 in_RCX,in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
      operator_delete(local_90.val._M_dataplus._M_p,local_90.val.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return true;
    }
  }
  else {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              (&local_b0,(tinyformat *)"\'%s\' received invalid response, expected array of signers"
               ,(char *)command,in_RCX);
    std::runtime_error::runtime_error(prVar10,(string *)&local_b0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_0034bd87:
  __stack_chk_fail();
}

Assistant:

bool ExternalSigner::Enumerate(const std::string& command, std::vector<ExternalSigner>& signers, const std::string chain)
{
    // Call <command> enumerate
    const UniValue result = RunCommandParseJSON(command + " enumerate");
    if (!result.isArray()) {
        throw std::runtime_error(strprintf("'%s' received invalid response, expected array of signers", command));
    }
    for (const UniValue& signer : result.getValues()) {
        // Check for error
        const UniValue& error = signer.find_value("error");
        if (!error.isNull()) {
            if (!error.isStr()) {
                throw std::runtime_error(strprintf("'%s' error", command));
            }
            throw std::runtime_error(strprintf("'%s' error: %s", command, error.getValStr()));
        }
        // Check if fingerprint is present
        const UniValue& fingerprint = signer.find_value("fingerprint");
        if (fingerprint.isNull()) {
            throw std::runtime_error(strprintf("'%s' received invalid response, missing signer fingerprint", command));
        }
        const std::string& fingerprintStr{fingerprint.get_str()};
        // Skip duplicate signer
        bool duplicate = false;
        for (const ExternalSigner& signer : signers) {
            if (signer.m_fingerprint.compare(fingerprintStr) == 0) duplicate = true;
        }
        if (duplicate) break;
        std::string name;
        const UniValue& model_field = signer.find_value("model");
        if (model_field.isStr() && model_field.getValStr() != "") {
            name += model_field.getValStr();
        }
        signers.emplace_back(command, chain, fingerprintStr, name);
    }
    return true;
}